

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O3

void __thiscall OpenMD::StatWriter::writeReal(StatWriter *this,int i)

{
  RealType RVar1;
  string local_38;
  
  RVar1 = Stats::getRealData(this->stats_,i);
  if (0x7fefffffffffffff < (ulong)ABS(RVar1)) {
    Stats::getTitle_abi_cxx11_(&local_38,this->stats_,i);
    snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s ",
             local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    simError();
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\t",1);
  std::ostream::_M_insert<double>(RVar1);
  return;
}

Assistant:

void StatWriter::writeReal(int i) {
    RealType s = stats_->getRealData(i);

    if (!std::isinf(s) && !std::isnan(s)) {
      statfile_ << "\t" << s;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StatWriter detected a numerical error writing: %s ",
               stats_->getTitle(i).c_str());
      painCave.isFatal = 1;
      simError();
    }
  }